

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha256.cpp
# Opt level: O2

int ztransform(uint8_t *msg,uint32_t *h)

{
  uint32_t uVar1;
  long lVar2;
  uint32_t uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint32_t uVar9;
  uint uVar10;
  int iVar11;
  uint uVar12;
  uint auStack_178 [9];
  int local_154 [5];
  uint local_140 [68];
  
  for (lVar2 = 0; lVar2 != 0x10; lVar2 = lVar2 + 1) {
    uVar7 = *(uint *)(msg + lVar2 * 4);
    local_140[lVar2 + 2] =
         uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 | uVar7 << 0x18;
  }
  for (lVar2 = 0x10; lVar2 != 0x40; lVar2 = lVar2 + 1) {
    uVar7 = local_140[lVar2];
    uVar8 = auStack_178[lVar2 + 1];
    local_140[lVar2 + 2] =
         (uVar7 >> 10 ^ (uVar7 << 0xd | uVar7 >> 0x13) ^ (uVar7 << 0xf | uVar7 >> 0x11)) +
         local_154[lVar2] + auStack_178[lVar2] +
         (uVar8 >> 3 ^ (uVar8 << 0xe | uVar8 >> 0x12) ^ (uVar8 << 0x19 | uVar8 >> 7));
  }
  uVar1 = *h;
  uVar9 = h[1];
  uVar7 = h[2];
  uVar8 = h[3];
  uVar4 = h[4];
  uVar3 = h[5];
  uVar12 = h[6];
  uVar10 = h[7];
  for (lVar2 = 0; uVar6 = uVar12, uVar12 = uVar3, uVar3 = uVar4, uVar5 = uVar7, uVar7 = uVar9,
      uVar9 = uVar1, lVar2 != 0x100; lVar2 = lVar2 + 4) {
    iVar11 = uVar10 + ((uVar12 ^ uVar6) & uVar3 ^ uVar6) +
             ((uVar3 << 7 | uVar3 >> 0x19) ^
             (uVar3 << 0x15 | uVar3 >> 0xb) ^ (uVar3 << 0x1a | uVar3 >> 6)) +
             *(int *)((long)k + lVar2) + *(int *)((long)local_140 + lVar2 + 8);
    uVar4 = uVar8 + iVar11;
    uVar1 = (uVar7 & uVar5 ^ (uVar7 ^ uVar5) & uVar9) +
            ((uVar9 << 10 | uVar9 >> 0x16) ^
            (uVar9 << 0x13 | uVar9 >> 0xd) ^ (uVar9 << 0x1e | uVar9 >> 2)) + iVar11;
    uVar8 = uVar5;
    uVar10 = uVar6;
  }
  *h = uVar9 + *h;
  h[1] = uVar7 + h[1];
  h[2] = uVar5 + h[2];
  h[3] = uVar8 + h[3];
  h[4] = uVar3 + h[4];
  h[5] = uVar12 + h[5];
  h[6] = uVar6 + h[6];
  h[7] = uVar10 + h[7];
  return 0x1073a0;
}

Assistant:

static int ztransform(const uint8_t *msg, uint32_t *h)
{
    uint32_t w[64];
    uint32_t a0, b1, c2, d3, e4, f5, g6, h7;
    uint32_t t1, t2;

    int i = 0;
    int j = 0;

    for (i=0; i<16; i++) {
        w[i] = msg[j]<<24 | msg[j+1]<<16 | msg[j+2]<<8 | msg[j+3];
        j += 4;
    }

    for(i=16; i<64; i++){
        w[i] = SSIG1(w[i-2])+w[i-7]+SSIG0(w[i-15])+w[i-16];
    }

    zdump_hex((uint8_t*)w, 64*4);

    a0 = h[0];
    b1 = h[1];
    c2 = h[2];
    d3 = h[3];
    e4 = h[4];
    f5 = h[5];
    g6 = h[6];
    h7 = h[7];

    for (i= 0; i<64; i++) {
        t1 = h7 + BSIG1(e4) + CHX(e4, f5, g6) + k[i] + w[i];
        t2 = BSIG0(a0) + MAJ(a0, b1, c2);

        h7 = g6;
        g6 = f5;
        f5 = e4;
        e4 = d3 + t1;
        d3 = c2;
        c2 = b1;
        b1 = a0;
        a0 = t1 + t2;
    }

    h[0] += a0;
    h[1] += b1;
    h[2] += c2;
    h[3] += d3;
    h[4] += e4;
    h[5] += f5;
    h[6] += g6;
    h[7] += h7;

    return 0;
}